

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

void __thiscall
VertexClustering::calcCurvature
          (VertexClustering *this,vector<VCFace_*,_std::allocator<VCFace_*>_> *faces)

{
  double *pdVar1;
  _Rb_tree_header *p_Var2;
  pointer ppVVar3;
  VCFace *f;
  VertexGroup *pVVar4;
  pointer pMVar5;
  _Base_ptr p_Var6;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar7;
  long lVar8;
  clock_t cVar9;
  long lVar10;
  int iVar11;
  pointer ppVVar12;
  VertexClustering *this_00;
  double *pdVar13;
  VertexClustering *this_01;
  int iVar14;
  Scalar tmp;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  pts;
  Vector2d eValues;
  Matrix2d eVecs;
  Matrix3d Stretch;
  set<int,_std::less<int>,_std::allocator<int>_> rings;
  Matrix3d o2w;
  vector<double,_std::allocator<double>_> poly;
  ulong local_260;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_258;
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  clock_t local_1b0;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *local_1a8;
  pointer local_1a0;
  double local_198;
  double local_190;
  Scalar local_188;
  Scalar local_180;
  Scalar local_178;
  double local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_150;
  Vector2d local_138;
  Matrix2d local_128;
  Matrix<double,_3,_3,_0,_3,_3> local_108;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c0;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  VertexGroup *local_48;
  
  printf("start to calculate curvature for %lu faces...\n",
         (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3);
  local_1b0 = clock();
  ppVVar12 = (faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppVVar3 = (faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_1a8 = faces;
  if (ppVVar12 != ppVVar3) {
    local_260 = (ulong)((long)ppVVar3 - (long)ppVVar12 >> 3) / 10;
    iVar14 = 1;
    iVar11 = 0;
    do {
      f = *ppVVar12;
      local_1a0 = ppVVar12;
      collectRings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_c0,this,f);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::vector(&local_150,local_c0._M_impl.super__Rb_tree_header._M_node_count,
               (allocator_type *)&local_90);
      pMVar5 = local_150.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 = &local_c0._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
        dVar16 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
        dVar15 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
        dVar23 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
        pVVar4 = this->vGroup;
        pdVar13 = ((local_150.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array + 2;
        p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          lVar10 = (long)(int)p_Var6[1]._M_color * 0x50;
          dVar19 = *(double *)(&pVVar4->field_0x18 + lVar10);
          pdVar1 = (double *)(&pVVar4->field_0x8 + lVar10);
          dVar22 = pdVar1[1];
          ((plain_array<double,_3,_0,_0> *)(pdVar13 + -2))->array[0] = *pdVar1 - dVar16;
          pdVar13[-1] = dVar22 - dVar15;
          *pdVar13 = dVar19 - dVar23;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          pdVar13 = pdVar13 + 3;
        } while ((_Rb_tree_header *)p_Var6 != p_Var2);
      }
      this_00 = (VertexClustering *)&f->normal;
      make_coord_space((Matrix3d *)&local_90,(Vector3d *)this_00);
      dVar16 = local_68;
      dVar23 = local_70;
      local_238 = local_90;
      dStack_230 = 0.0;
      local_228 = local_88;
      dStack_220 = 0.0;
      local_208 = local_78;
      dStack_200 = 0.0;
      local_218 = local_80;
      dStack_210 = 0.0;
      lVar10 = (long)local_150.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5;
      if (lVar10 != 0) {
        lVar10 = (lVar10 >> 3) * -0x5555555555555555;
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        pdVar13 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array + 2;
        do {
          dVar15 = ((plain_array<double,_3,_0,_0> *)(pdVar13 + -2))->array[0];
          dVar19 = pdVar13[-1];
          dVar22 = *pdVar13;
          ((plain_array<double,_3,_0,_0> *)(pdVar13 + -2))->array[0] =
               dVar22 * local_80 + dVar19 * local_88 + dVar15 * local_90;
          pdVar13[-1] = dVar22 * local_68 + dVar19 * local_70 + dVar15 * local_78;
          *pdVar13 = local_50 * dVar22 + local_58 * dVar19 + local_60 * dVar15;
          pdVar13 = pdVar13 + 3;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      this_01 = (VertexClustering *)&stack0xffffffffffffffb8;
      leastSquareFitting((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffb8,this_00
                         ,&local_150);
      dVar15 = localCurvature(this_01,(vector<double,_std::allocator<double>_> *)
                                      &stack0xffffffffffffffb8,&local_138,&local_128);
      f->area = dVar15 * f->area;
      if ((this->opts).anisotropic == true) {
        local_1e8 = local_128.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                    .m_data.array[2];
        dStack_1e0 = local_128.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[0];
        local_1d8 = local_128.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                    .m_data.array[3];
        dStack_1d0 = local_128.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[1];
        local_1c8 = ABS(local_138.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array[0]);
        local_258.m_xpr = &local_108;
        local_258.m_row = 0;
        local_258.m_col = 1;
        local_258.m_currentBlockRows = 1;
        dStack_1c0 = 0.0;
        local_158 = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = local_1c8;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (&local_258,&local_158);
        local_160 = 0.0;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar7,&local_160);
        local_168 = 0.0;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar7,&local_168);
        local_1f8 = ABS(local_138.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array[1]);
        uStack_1f0 = 0;
        local_170 = local_1f8;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar7,&local_170);
        local_178 = 0.0;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar7,&local_178);
        local_180 = 0.0;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar7,&local_180);
        local_188 = 0.0;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar7,&local_188);
        local_190 = local_1c8;
        local_198 = local_1f8;
        pdVar13 = &local_190;
        if (local_1c8 < local_1f8) {
          pdVar13 = &local_198;
        }
        Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar7,pdVar13);
        if ((local_258.m_currentBlockRows + local_258.m_row != 3) || (local_258.m_col != 3)) {
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CommaInitializer.h"
                        ,0x6f,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                       );
        }
        dVar15 = local_208 * local_1d8 + local_238 * local_1e8;
        dStack_220 = local_208 * dStack_1d0 + local_238 * dStack_1e0;
        auVar21._0_8_ = dVar15 * dVar15;
        auVar21._8_8_ = dStack_220 * dStack_220;
        dVar22 = dVar23 * local_1d8 + local_228 * local_1e8;
        dVar23 = dVar23 * dStack_1d0 + local_228 * dStack_1e0;
        auVar20._0_8_ = dVar16 * local_1d8 + local_218 * local_1e8;
        auVar20._8_8_ = dVar16 * dStack_1d0 + local_218 * dStack_1e0;
        auVar17._8_8_ = auVar20._8_8_ * auVar20._8_8_ + dVar23 * dVar23 + auVar21._8_8_;
        auVar17._0_8_ = auVar20._0_8_ * auVar20._0_8_ + dVar22 * dVar22 + auVar21._0_8_;
        auVar17 = sqrtpd(auVar21,auVar17);
        auVar27._8_8_ = dVar23;
        auVar27._0_8_ = dVar15;
        auVar27 = divpd(auVar27,auVar17);
        dVar22 = dVar22 / auVar17._0_8_;
        auVar21 = divpd(auVar20,auVar17);
        dStack_1c0 = dStack_220 / auVar17._8_8_;
        dVar26 = auVar27._0_8_;
        local_208 = auVar27._8_8_;
        dVar19 = auVar21._0_8_;
        local_238 = auVar21._8_8_;
        dVar24 = local_208 * dVar19 - dVar22 * local_238;
        dVar25 = dVar26 * local_238 - dVar19 * dStack_1c0;
        local_228 = dStack_1c0 * dVar22 - dVar26 * local_208;
        local_1f8 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
        uStack_1f0 = 0;
        local_1e8 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2];
        dStack_1e0 = 0.0;
        dVar23 = local_228 *
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] +
                 dVar19 * local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[1] +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * local_238;
        dVar16 = local_228 *
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] +
                 dVar19 * local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[4] +
                 local_238 *
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
        local_1d8 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[8];
        dStack_1d0 = 0.0;
        dVar15 = local_228 *
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
                 dVar19 * local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[7] +
                 local_238 *
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
        local_218 = dVar15 * local_228 + dVar16 * dVar19 + local_238 * dVar23;
        dVar32 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] * dVar24 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] * dVar26 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * dStack_1c0;
        dVar33 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] * dVar25 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] * dVar22 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * local_208;
        dVar30 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * dVar24 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * dVar26 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * dStack_1c0;
        dVar31 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * dVar25 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * dVar22 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * local_208;
        dVar28 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] * dVar24 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * dVar26 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * dStack_1c0;
        dVar29 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] * dVar25 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * dVar22 +
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * local_208;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [0] = dVar24 * dVar28 + dVar26 * dVar30 + dStack_1c0 * dVar32;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [1] = dVar24 * dVar29 + dVar26 * dVar31 + dStack_1c0 * dVar33;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [2] = dVar15 * dVar24 + dVar26 * dVar16 + dVar23 * dStack_1c0;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [3] = dVar28 * dVar25 + dVar30 * dVar22 + local_208 * dVar32;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [4] = dVar25 * dVar29 + dVar22 * dVar31 + dVar33 * local_208;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [5] = dVar25 * dVar15 + dVar22 * dVar16 + dVar23 * local_208;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [6] = local_228 * dVar28 + dVar19 * dVar30 + local_238 * dVar32;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [7] = local_228 * dVar29 + dVar19 * dVar31 + local_238 * dVar33;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [8] = local_218;
        dStack_230 = local_238;
        dStack_210 = dStack_220;
        dStack_200 = local_208;
        local_1c8 = local_238;
      }
      if ((int)local_260 <= iVar11) {
        printf("%%%d...\n",(ulong)(uint)(iVar14 * 10));
        lVar10 = (long)(local_1a8->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_1a8->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        lVar8 = lVar10 >> 3;
        auVar18._8_4_ = (int)(lVar10 >> 0x23);
        auVar18._0_8_ = lVar8;
        auVar18._12_4_ = 0x45300000;
        iVar14 = iVar14 + 1;
        local_260 = (ulong)(uint)(int)((double)iVar14 *
                                      (((auVar18._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0
                                       )) / 10.0));
      }
      if (local_48 != (VertexGroup *)0x0) {
        operator_delete(local_48);
      }
      if (local_150.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar11 = iVar11 + 1;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_c0);
      ppVVar12 = local_1a0 + 1;
    } while (ppVVar12 != ppVVar3);
  }
  cVar9 = clock();
  printf("Done, uses %lf s for curvature.\n",(double)(cVar9 - local_1b0) / 1000000.0);
  return;
}

Assistant:

void VertexClustering::calcCurvature(vector<VCFace*> & faces)
{
	printf("start to calculate curvature for %lu faces...\n", faces.size());
	clock_t start = clock();
	int cnt = 0, n10 = faces.size() / 10, percent = 1;
	for (VCFace* f : faces) {
		set<int> rings(collectRings(f));
		vector<Vector3d> pts(rings.size());
		int i = 0;
		Vector3d origin = f->center;
		for (int id : rings)
			pts[i++] = vGroup->group[id].pos - origin;
		Matrix3d o2w;
		make_coord_space(o2w, f->normal);
		Matrix3d w2o = o2w.transpose();
		for (i = 0; i < pts.size(); i++) {
			pts[i] = w2o * pts[i]; //now pts are in object coordinate
		}
		vector<double> poly(leastSquareFitting(pts));
		Matrix2d eVecs;
		Vector2d eValues;
		double weight = localCurvature(poly, eValues, eVecs);
		f->area *= weight;       //update density based on curvature
		if (opts.anisotropic) {  
			//D1, D2 are the priciple directions in xyz coordinate, their eigenvalues are principle curvatures
			Vector3d D1 = (o2w.col(0) * eVecs(0, 0) + o2w.col(1) * eVecs(1, 0)).normalized();
			Vector3d D2 = (o2w.col(0) * eVecs(0, 1) + o2w.col(1) * eVecs(1, 1)).normalized();
			Matrix3d Rotation;
			Rotation.col(0) = D1;
			Rotation.col(1) = D2;
			Rotation.col(2) = D1.cross(D2);
			Matrix3d Stretch;
			Stretch << fabs(eValues(0)), 0, 0,
				0, fabs(eValues(1)), 0,
				0, 0, max(fabs(eValues(0)), fabs(eValues(1)));
			f->K = Rotation * Stretch * Rotation.transpose(); //compute the Riemannian metric
		}
		if (++cnt > n10) {
			printf("%%%d...\n", 10 * percent);
			n10 = faces.size() / 10.0 * ++percent;
		}
	}
	printf("Done, uses %lf s for curvature.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
}